

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void readSOF(FILE *f)

{
  byte bVar1;
  uchar uVar2;
  uchar uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  uchar v [3];
  
  EnterNewSection(f,"SOF");
  fseek((FILE *)f,1,1);
  fread(v,1,2,(FILE *)f);
  image_0 = (uint)(ushort)(v._0_2_ << 8 | (ushort)v._0_2_ >> 8);
  fread(v,1,2,(FILE *)f);
  image_1 = (uint)(ushort)(v._0_2_ << 8 | (ushort)v._0_2_ >> 8);
  printf(anon_var_dwarf_2ecf,(ulong)image_0);
  fseek((FILE *)f,1,1);
  iVar6 = 3;
  bVar1 = maxWidth;
  while (maxWidth = bVar1, bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    fread(v,1,3,(FILE *)f);
    uVar2 = v[0];
    uVar4 = (ulong)v[0];
    printf(anon_var_dwarf_2ee6,uVar4);
    uVar5 = (uint)v[1];
    bVar1 = v[1] >> 4;
    printf(anon_var_dwarf_2efd,(ulong)bVar1);
    uVar5 = uVar5 & 0xf;
    printf(anon_var_dwarf_2f14,(ulong)uVar5);
    uVar3 = v[2];
    printf(anon_var_dwarf_2f1f,(ulong)v[2]);
    subVector[uVar4].id = uVar2;
    subVector[uVar4].width = bVar1;
    subVector[uVar4].height = (byte)uVar5;
    if ((byte)uVar5 < maxHeight) {
      uVar5 = (uint)maxHeight;
    }
    subVector[uVar4].quant = uVar3;
    maxHeight = (uchar)uVar5;
    if (bVar1 < maxWidth) {
      bVar1 = maxWidth;
    }
  }
  return;
}

Assistant:

void readSOF(FILE *f) {
    unsigned int len = EnterNewSection(f, "SOF");
    fseek(f, 1, SEEK_CUR); // 精度
    unsigned char v[3];
    fread(v, 1, 2, f);
    image.height = v[0] * 256 + v[1];
    fread(v, 1, 2, f);
    image.width = v[0] * 256 + v[1];
    printf("高*寬: %d*%d\n", image.height, image.width);
    fseek(f, 1, SEEK_CUR); // 顏色分量數，固定為3
    for (int i = 0; i < 3; i++) {
        fread(v, 1, 3, f);
        printf("顏色分量ID：%d\n", v[0]);
        printf("水平採樣因子：%d\n", v[1] >> 4);
        printf("垂直採樣因子：%d\n", v[1] & 0x0F);
        printf("量化表ID：%d\n", v[2]);
        subVector[v[0]].id = v[0];
        subVector[v[0]].width = v[1] >> 4;
        subVector[v[0]].height = v[1] & 0x0F;
        subVector[v[0]].quant = v[2];
        maxHeight = (maxHeight > subVector[v[0]].height ? maxHeight : subVector[v[0]].height);
        maxWidth = (maxWidth > subVector[v[0]].width ? maxWidth : subVector[v[0]].width);
    }
}